

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O2

void __thiscall sptk::reaper::FdFilter::MirrorFilter(FdFilter *this,float *fc,bool invert)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  iVar1 = this->n_filter_coeffs_;
  lVar6 = (long)iVar1;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar5 = lVar6 * 4;
  }
  pfVar2 = (float *)operator_new__(uVar5);
  this->filter_coeffs_ = pfVar2;
  iVar1 = iVar1 / 2;
  fVar7 = 0.0;
  pfVar3 = pfVar2;
  for (lVar4 = 0; 0 < iVar1 + (int)lVar4; lVar4 = lVar4 + -1) {
    fVar8 = fc[iVar1 + lVar4];
    if (invert) {
      fVar7 = fVar7 + fVar8;
      fVar8 = -fVar8;
    }
    *pfVar3 = fVar8;
    pfVar3 = pfVar3 + 1;
    pfVar2[lVar6 + lVar4 + -1] = fVar8;
  }
  if (invert) {
    fVar7 = (fVar7 + fVar7 + fc[iVar1 + lVar4]) - fc[iVar1 + lVar4];
  }
  else {
    fVar7 = fc[iVar1 + lVar4];
  }
  pfVar2[lVar6 + lVar4 + -1] = fVar7;
  return;
}

Assistant:

void FdFilter::MirrorFilter(float *fc, bool invert) {
  float *dp1, *dp2, *dp3, sum, integral;
  int i, ncoefb2;

  filter_coeffs_ = new float[n_filter_coeffs_];
  ncoefb2 = 1 + n_filter_coeffs_ / 2;
  // Copy the half-filter and its mirror image into the coefficient array.
  for (i = ncoefb2 - 1, dp3 = fc+ncoefb2 - 1, dp2 = filter_coeffs_,
       dp1 = filter_coeffs_ + n_filter_coeffs_ - 1, integral = 0.0; i-- > 0;) {
    if (!invert) {
      *dp1-- = *dp2++ = *dp3--;
    } else {
      integral += (sum = *dp3--);
      *dp1-- = *dp2++ = -sum;
    }
  }
  if (!invert) {
    *dp1 = *dp3; /* point of symmetry */
  } else {
    integral *= 2;
    integral += *dp3;
    *dp1 = integral - *dp3;
  }
}